

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

ssize_t strhex_from_bin(char *buffer,size_t buffer_len,uint8_t *src,size_t src_len)

{
  long lVar1;
  size_t sVar2;
  
  if (src_len * 2 < buffer_len) {
    lVar1 = 0;
    for (sVar2 = 0; src_len != sVar2; sVar2 = sVar2 + 1) {
      buffer[sVar2 * 2] = "0123456789abcdef"[src[sVar2] >> 4];
      buffer[sVar2 * 2 + 1] = "0123456789abcdef"[src[sVar2] & 0xf];
      lVar1 = lVar1 + -2;
    }
    buffer[sVar2 * 2] = '\0';
    return -lVar1;
  }
  return -1;
}

Assistant:

ssize_t
strhex_from_bin(char *buffer, size_t buffer_len, const uint8_t *src, size_t src_len) {
  static char HEX[] = "0123456789abcdef";
  size_t i, j;
  if (buffer_len < src_len*2+1) {
    return -1;
  }

  for (i=0, j=0; i<src_len; i++) {
    buffer[j++] = HEX[src[i] >> 4];
    buffer[j++] = HEX[src[i] & 0x0f];
  }
  buffer[j] = 0;
  return j;
}